

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classical_ising_polynomial.hpp
# Opt level: O2

void __thiscall
openjij::test::PolySystemCIP_ConstructorGraphSparseInt2_Test::TestBody
          (PolySystemCIP_ConstructorGraphSparseInt2_Test *this)

{
  allocator<char> local_81;
  _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_80;
  string local_48;
  string local_28;
  
  GeneratePolynomialInteractionsSparseInt2<double>();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"Sparse",&local_81);
  TestCIPConstructorGraph<unsigned_long,double>
            ((Polynomial<unsigned_long,_double> *)&local_80,SPIN,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::
  _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_80);
  GeneratePolynomialInteractionsSparseInt2<double>();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Sparse",&local_81);
  TestCIPConstructorGraph<unsigned_long,double>
            ((Polynomial<unsigned_long,_double> *)&local_80,BINARY,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::
  _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_80);
  return;
}

Assistant:

TEST(PolySystemCIP, ConstructorGraphSparseInt2) {
   TestCIPConstructorGraph<openjij::graph::Index, double>(GeneratePolynomialInteractionsSparseInt2<double>(), cimod::Vartype::SPIN, "Sparse");
   TestCIPConstructorGraph<openjij::graph::Index, double>(GeneratePolynomialInteractionsSparseInt2<double>(), cimod::Vartype::BINARY, "Sparse");
}